

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_memory.cpp
# Opt level: O0

void __thiscall LiteScript::_BasicMemory_1::FlagsErase(_BasicMemory_1 *this)

{
  value_type_conflict1 vVar1;
  uint uVar2;
  bool bVar3;
  reference pp_Var4;
  reference pvVar5;
  uint nb;
  uint uStack_14;
  bool wasFull;
  uint sz;
  uint i;
  _BasicMemory_1 *this_local;
  
  for (uStack_14 = 0; uStack_14 < 0x100; uStack_14 = uStack_14 + 1) {
    pp_Var4 = std::array<LiteScript::_BasicMemory_0_*,_256UL>::operator[]
                        (&this->arr,(ulong)uStack_14);
    if (*pp_Var4 != (value_type)0x0) {
      pp_Var4 = std::array<LiteScript::_BasicMemory_0_*,_256UL>::operator[]
                          (&this->arr,(ulong)uStack_14);
      bVar3 = _BasicMemory_0::isFull(*pp_Var4);
      pp_Var4 = std::array<LiteScript::_BasicMemory_0_*,_256UL>::operator[]
                          (&this->arr,(ulong)uStack_14);
      uVar2 = *(*pp_Var4)->Count;
      pp_Var4 = std::array<LiteScript::_BasicMemory_0_*,_256UL>::operator[]
                          (&this->arr,(ulong)uStack_14);
      _BasicMemory_0::FlagsErase(*pp_Var4);
      if (bVar3) {
        pp_Var4 = std::array<LiteScript::_BasicMemory_0_*,_256UL>::operator[]
                            (&this->arr,(ulong)uStack_14);
        bVar3 = _BasicMemory_0::isFull(*pp_Var4);
        if (!bVar3) {
          vVar1 = this->first_nfull;
          pvVar5 = std::array<short,_256UL>::operator[](&this->nfull,(ulong)uStack_14);
          *pvVar5 = vVar1;
          this->first_nfull = (short)uStack_14;
        }
      }
      pp_Var4 = std::array<LiteScript::_BasicMemory_0_*,_256UL>::operator[]
                          (&this->arr,(ulong)uStack_14);
      if (uVar2 != *(*pp_Var4)->Count) {
        this->count = this->count - 1;
      }
    }
  }
  return;
}

Assistant:

void LiteScript::_BasicMemory_1::FlagsErase() {
    for (unsigned int i = 0, sz = LITESCRIPT_MEMORY_1_SIZE; i < sz; i++) {
        if (this->arr[i] != nullptr) {
            bool wasFull = this->arr[i]->isFull();
            unsigned int nb = this->arr[i]->Count;
            this->arr[i]->FlagsErase();
            // Si le block n'est plus plein, on le place en premier
            if (wasFull && !this->arr[i]->isFull()) {
                this->nfull[i] = this->first_nfull;
                this->first_nfull = (short)i;
            }
            // Si le nombre d'objet à diminué, on décrémente le compteur
            if (nb != this->arr[i]->Count)
                this->count--;
        }
    }
}